

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O3

int lws_state_transition(lws_state_manager_t *mgr,int target)

{
  if (mgr->state != target) {
    _lws_state_transition(mgr,target);
  }
  return 0;
}

Assistant:

static int
_lws_state_transition(lws_state_manager_t *mgr, int target)
{
#if defined(_DEBUG)
	char temp8[8];
#endif

	if (_report(mgr, mgr->state, target))
		return 1;

#if defined(_DEBUG)
	lwsl_debug("%s: %s: changed %d '%s' -> %d '%s'\n", __func__, mgr->name,
		   mgr->state, _systnm(mgr, mgr->state, temp8), target,
		   _systnm(mgr, target, temp8));
#endif

	mgr->state = target;

	/* Indicate success by calling the notifers again with both args same */
	_report(mgr, target, target);

	return 0;
}